

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_int8.c
# Opt level: O1

rt_function_error_t exec_convolution_int8(rt_function_t *f)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int *piVar19;
  char cVar20;
  char cVar21;
  long lVar22;
  long lVar23;
  long *plVar24;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  int i_pos [3];
  int w_pos [3];
  int o_pos [3];
  int local_11c;
  int local_118;
  int local_114;
  int local_110 [4];
  int local_100;
  int local_fc;
  int local_f8;
  uint local_f4;
  int *local_f0;
  int *local_e8;
  long *local_e0;
  undefined8 local_d8;
  ulong local_d0;
  uint local_c4;
  int local_c0 [6];
  ulong local_a8;
  long local_a0;
  int *local_98;
  int *local_90;
  ulong local_88;
  long local_80;
  int *local_78;
  ulong local_70;
  long local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int local_48;
  int local_44;
  long *local_40;
  ulong local_38;
  
  local_40 = (long *)f->local_context;
  plVar24 = (long *)*local_40;
  local_110[3] = (int)local_40[8];
  local_fc = *(int *)(plVar24[10] + 8);
  local_100 = ((int *)plVar24[2])[2];
  shape._4_4_ = 0;
  shape.size = *(uint *)(plVar24 + 1);
  shape.data = (int *)plVar24[2];
  uVar7 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = *(uint *)(plVar24 + 0x19);
  shape_00.data = (int *)plVar24[0x1a];
  uVar8 = calc_shape_size(shape_00);
  lVar16 = plVar24[0x18];
  if (lVar16 != 0) {
    bVar1 = *(byte *)(lVar16 + 0x10) >> 4;
    bVar2 = *(byte *)(*plVar24 + 0x10) >> 4;
    if (bVar2 < bVar1) {
      if (uVar8 != 0) {
        lVar16 = *(long *)(lVar16 + 0x18);
        uVar18 = 0;
        do {
          *(char *)(lVar16 + uVar18) =
               (char)((int)*(char *)(lVar16 + uVar18) / (1 << (bVar1 - bVar2 & 0x1f)));
          uVar18 = uVar18 + 1;
        } while (uVar8 != uVar18);
      }
    }
    else if (bVar1 < bVar2) {
      puts(
          "OUTPUT variable has less range bits than BIAS variable. Please make sure conv/b has same or less range bits than Output to avoid overflow."
          );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  memset(*(void **)(*plVar24 + 0x18),0,(ulong)uVar7);
  local_c4 = *(uint *)plVar24[10];
  local_e0 = plVar24;
  if ((int)plVar24[0x28] == 2) {
    if (local_c4 == 0) {
      return RT_FUNCTION_ERROR_NOERROR;
    }
    local_f0 = (int *)0x0;
    do {
      local_c0[3] = (int)local_f0;
      if (local_110[3] != 0) {
        local_11c = 0;
        do {
          if (local_100 != 0) {
            local_c0[5] = 0;
            do {
              local_c0[4] = local_11c;
              iVar9 = (int)plVar24[3];
              iVar13 = 0;
              if (0 < iVar9) {
                if (2 < iVar9) {
                  iVar9 = 3;
                }
                lVar16 = 0;
                iVar13 = 0;
                do {
                  iVar13 = iVar13 + *(int *)(plVar24[4] + lVar16 * 4) * local_c0[lVar16 + 3];
                  lVar16 = lVar16 + 1;
                } while (iVar9 != (int)lVar16);
              }
              *(int *)(plVar24 + 7) = iVar13;
              if (local_fc != 0) {
                local_110[2] = 0;
                local_f8 = local_c0[5];
                local_c0[1] = local_c0[5];
                do {
                  local_110[0] = local_c0[3];
                  local_110[1] = local_11c;
                  local_c0[0] = local_11c;
                  local_c0[2] = local_110[2];
                  iVar9 = (int)plVar24[0xb];
                  iVar13 = 0;
                  if (0 < iVar9) {
                    if (2 < iVar9) {
                      iVar9 = 3;
                    }
                    lVar16 = 0;
                    iVar13 = 0;
                    do {
                      iVar13 = iVar13 + *(int *)(plVar24[0xc] + lVar16 * 4) * local_110[lVar16];
                      lVar16 = lVar16 + 1;
                    } while (iVar9 != (int)lVar16);
                  }
                  *(int *)(plVar24 + 0xf) = iVar13;
                  iVar9 = (int)plVar24[0x13];
                  local_80 = CONCAT44(local_80._4_4_,local_110[2]);
                  if (iVar9 < 1) {
                    iVar13 = 0;
                  }
                  else {
                    if (2 < iVar9) {
                      iVar9 = 3;
                    }
                    lVar16 = 0;
                    iVar13 = 0;
                    do {
                      iVar13 = iVar13 + *(int *)(plVar24[0x14] + lVar16 * 4) * local_c0[lVar16];
                      lVar16 = lVar16 + 1;
                    } while (iVar9 != (int)lVar16);
                  }
                  *(int *)(plVar24 + 0x17) = iVar13;
                  local_58 = (int *)plVar24[0x2e];
                  if (0 < *local_58) {
                    piVar5 = (int *)plVar24[0x2a];
                    local_98 = (int *)local_40[5];
                    local_50 = (int *)local_40[7];
                    local_60 = (int *)plVar24[0x2c];
                    local_68 = *(long *)(*plVar24 + 0x18);
                    lVar16 = *(long *)(plVar24[8] + 0x18);
                    local_a0 = *(long *)(plVar24[0x10] + 0x18);
                    local_78 = (int *)local_40[3];
                    local_114 = 0;
                    local_e8 = (int *)CONCAT44(local_e8._4_4_,-*local_78);
                    iVar9 = 1 << (((*(byte *)(plVar24[8] + 0x10) >> 4) +
                                  (*(byte *)(plVar24[0x10] + 0x10) >> 4)) -
                                  (*(byte *)(*plVar24 + 0x10) >> 4) & 0x1f);
                    local_70 = CONCAT44(local_70._4_4_,iVar9);
                    do {
                      local_d8 = (ulong)(uint)local_58[1];
                      if (0 < local_58[1]) {
                        local_f4 = -local_78[1];
                        local_d0 = 0;
                        piVar19 = local_60;
                        do {
                          local_88 = (ulong)*piVar19;
                          if ((long)local_88 < 1) {
                            iVar13 = 0;
                          }
                          else {
                            uVar7 = piVar19[1];
                            local_90 = (int *)(long)(int)local_f4;
                            lVar22 = 0;
                            iVar13 = 0;
                            lVar14 = local_a0;
                            do {
                              if (0 < (int)uVar7) {
                                iVar17 = *local_50 * (int)lVar22 + (int)local_e8;
                                lVar15 = lVar14;
                                uVar18 = (ulong)uVar7;
                                lVar23 = (long)(int)local_f4;
                                do {
                                  if (((-1 < lVar23) && (iVar3 = piVar5[1], lVar23 < iVar3)) &&
                                     ((-1 < iVar17 && (iVar17 < *piVar5)))) {
                                    iVar13 = iVar13 + (int)*(char *)(lVar15 + (ulong)*(uint *)(
                                                  plVar24 + 0x17)) *
                                                  (int)*(char *)(lVar23 + (ulong)(uint)(iVar3 * (*
                                                  local_50 * (int)lVar22 + (int)local_e8)) +
                                                  (ulong)*(uint *)(plVar24 + 0xf) + lVar16);
                                  }
                                  lVar15 = lVar15 + 1;
                                  lVar23 = lVar23 + local_50[1];
                                  uVar18 = uVar18 - 1;
                                } while (uVar18 != 0);
                              }
                              lVar22 = lVar22 + 1;
                              lVar14 = lVar14 + (ulong)uVar7;
                            } while (lVar22 != local_88);
                          }
                          lVar14 = (long)((int)local_d8 * local_114) +
                                   (ulong)*(uint *)(plVar24 + 7) + local_68;
                          iVar17 = iVar13 / iVar9 + (int)*(char *)(local_d0 + lVar14);
                          iVar13 = iVar17;
                          if (iVar17 < -0x7f) {
                            iVar13 = 0x80;
                          }
                          uVar12 = (undefined1)iVar13;
                          if (0x7e < iVar17) {
                            uVar12 = 0x7f;
                          }
                          *(undefined1 *)(local_d0 + lVar14) = uVar12;
                          local_d0 = local_d0 + 1;
                          local_f4 = local_f4 + local_98[1];
                          local_d8 = (ulong)local_58[1];
                          piVar19 = local_60;
                        } while ((long)local_d0 < (long)local_d8);
                      }
                      local_114 = local_114 + 1;
                      local_e8 = (int *)CONCAT44(local_e8._4_4_,(int)local_e8 + *local_98);
                    } while (local_114 < *local_58);
                  }
                  local_110[2] = local_110[2] + 1;
                  local_c0[1] = local_f8;
                } while (local_110[2] != local_fc);
              }
              local_110[0] = local_11c;
              local_110[1] = local_c0[5];
              lVar16 = plVar24[0x20];
              if (lVar16 != 0) {
                iVar9 = (int)plVar24[0x23];
                if (iVar9 < 1) {
                  iVar13 = 0;
                }
                else {
                  if (1 < iVar9) {
                    iVar9 = 2;
                  }
                  lVar14 = 0;
                  iVar13 = 0;
                  do {
                    iVar13 = iVar13 + *(int *)(plVar24[0x24] + lVar14 * 4) * local_110[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (iVar9 != (int)lVar14);
                }
                *(int *)(plVar24 + 0x27) = iVar13;
                lVar14 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar14) {
                  lVar22 = *(long *)(lVar16 + 0x18);
                  lVar15 = *(long *)(*plVar24 + 0x18);
                  bVar1 = *(byte *)(lVar16 + 0x10);
                  do {
                    *(char *)(lVar15 + (ulong)*(uint *)(plVar24 + 7)) =
                         (char)(((int)*(char *)(lVar15 + (ulong)*(uint *)(plVar24 + 7)) *
                                (int)*(char *)(lVar22 + (ulong)*(uint *)(plVar24 + 0x27))) /
                               (1 << (bVar1 >> 4)));
                    lVar15 = lVar15 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
              }
              if (plVar24[0x18] != 0) {
                iVar9 = (int)plVar24[0x1b];
                if (iVar9 < 1) {
                  iVar13 = 0;
                }
                else {
                  if (1 < iVar9) {
                    iVar9 = 2;
                  }
                  lVar16 = 0;
                  iVar13 = 0;
                  do {
                    iVar13 = iVar13 + *(int *)(plVar24[0x1c] + lVar16 * 4) * local_110[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (iVar9 != (int)lVar16);
                }
                *(int *)(plVar24 + 0x1f) = iVar13;
                lVar16 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar16) {
                  lVar14 = *(long *)(plVar24[0x18] + 0x18);
                  lVar22 = *(long *)(*plVar24 + 0x18);
                  do {
                    bVar1 = *(byte *)(lVar14 + (ulong)*(uint *)(plVar24 + 0x1f));
                    bVar2 = *(byte *)(lVar22 + (ulong)*(uint *)(plVar24 + 7));
                    cVar20 = bVar2 + bVar1;
                    if ((((char)bVar1 < '\x01') || ((char)bVar2 < '\x01')) ||
                       (cVar21 = '\x7f', -1 < cVar20)) {
                      cVar21 = cVar20;
                      if ('\0' < cVar20) {
                        cVar21 = -0x80;
                      }
                      if (-1 < (char)(bVar2 & bVar1)) {
                        cVar21 = cVar20;
                      }
                    }
                    *(char *)(lVar22 + (ulong)*(uint *)(plVar24 + 7)) = cVar21;
                    lVar22 = lVar22 + 1;
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                }
              }
              local_c0[5] = local_c0[5] + 1;
            } while (local_c0[5] != local_100);
          }
          local_11c = local_11c + 1;
        } while (local_11c != local_110[3]);
      }
      local_f0 = (int *)(ulong)(local_c0[3] + 1U);
    } while (local_c0[3] + 1U != local_c4);
  }
  else {
    if (local_c4 == 0) {
      return RT_FUNCTION_ERROR_NOERROR;
    }
    local_a8 = 0;
    do {
      if (local_110[3] != 0) {
        local_118 = 0;
        do {
          if (local_100 != 0) {
            local_48 = 0;
            do {
              local_c0[3] = (int)local_a8;
              local_c0[4] = local_118;
              local_c0[5] = local_48;
              iVar9 = (int)plVar24[3];
              iVar13 = 0;
              if (0 < iVar9) {
                if (2 < iVar9) {
                  iVar9 = 3;
                }
                lVar16 = 0;
                iVar13 = 0;
                do {
                  iVar13 = iVar13 + *(int *)(plVar24[4] + lVar16 * 4) * local_c0[lVar16 + 3];
                  lVar16 = lVar16 + 1;
                } while (iVar9 != (int)lVar16);
              }
              *(int *)(plVar24 + 7) = iVar13;
              if (local_fc != 0) {
                local_110[2] = 0;
                do {
                  local_110[0] = (int)local_a8;
                  local_110[1] = local_118;
                  local_c0[0] = local_118;
                  local_c0[1] = local_48;
                  local_c0[2] = local_110[2];
                  iVar9 = (int)plVar24[0xb];
                  iVar13 = 0;
                  if (0 < iVar9) {
                    if (2 < iVar9) {
                      iVar9 = 3;
                    }
                    lVar16 = 0;
                    iVar13 = 0;
                    do {
                      iVar13 = iVar13 + *(int *)(plVar24[0xc] + lVar16 * 4) * local_110[lVar16];
                      lVar16 = lVar16 + 1;
                    } while (iVar9 != (int)lVar16);
                  }
                  *(int *)(plVar24 + 0xf) = iVar13;
                  iVar9 = (int)plVar24[0x13];
                  local_44 = local_110[2];
                  if (iVar9 < 1) {
                    iVar13 = 0;
                  }
                  else {
                    if (2 < iVar9) {
                      iVar9 = 3;
                    }
                    lVar16 = 0;
                    iVar13 = 0;
                    do {
                      iVar13 = iVar13 + *(int *)(plVar24[0x14] + lVar16 * 4) * local_c0[lVar16];
                      lVar16 = lVar16 + 1;
                    } while (iVar9 != (int)lVar16);
                  }
                  *(int *)(plVar24 + 0x17) = iVar13;
                  uVar7 = *(uint *)(plVar24 + 0x28);
                  uVar8 = *(uint *)(plVar24 + 0x29);
                  piVar5 = (int *)plVar24[0x2a];
                  piVar19 = (int *)local_40[7];
                  lVar16 = local_40[3];
                  local_50 = (int *)local_40[5];
                  local_78 = (int *)CONCAT44(local_78._4_4_,(int)plVar24[0x31]);
                  local_90 = (int *)plVar24[0x32];
                  local_88 = CONCAT44(local_88._4_4_,(int)plVar24[0x2f]);
                  piVar6 = (int *)plVar24[0x30];
                  uVar10 = *(uint *)(plVar24 + 0x2b);
                  local_e8 = (int *)plVar24[0x2c];
                  local_80 = *(long *)(*plVar24 + 0x18);
                  local_98 = *(int **)(plVar24[8] + 0x18);
                  local_58 = *(int **)(plVar24[0x10] + 0x18);
                  uVar4 = *(uint *)(plVar24 + 0x2d);
                  shape_01._4_4_ = 0;
                  shape_01.size = uVar4;
                  local_f0 = (int *)plVar24[0x2e];
                  shape_01.data = local_f0;
                  iVar9 = calc_shape_size(shape_01);
                  local_d0 = CONCAT44(local_d0._4_4_,iVar9);
                  shape_02._4_4_ = 0;
                  shape_02.size = uVar10;
                  shape_02.data = local_e8;
                  local_f4 = uVar10;
                  uVar10 = calc_shape_size(shape_02);
                  uVar18 = local_d0 & 0xffffffff;
                  local_a0 = CONCAT44(local_a0._4_4_,uVar10);
                  if ((int)local_d0 != 0) {
                    local_f8 = 1 << (((*(byte *)(local_e0[8] + 0x10) >> 4) +
                                     (*(byte *)(local_e0[0x10] + 0x10) >> 4)) -
                                     (*(byte *)(*local_e0 + 0x10) >> 4) & 0x1f);
                    local_d0 = (ulong)uVar10;
                    uVar11 = 0;
                    local_68 = lVar16;
                    local_60 = piVar19;
                    local_38 = uVar18;
                    do {
                      out._0_8_ = (ulong)local_78 & 0xffffffff;
                      shape_04._4_4_ = 0;
                      shape_04.size = uVar4;
                      out.data = local_90;
                      shape_04.data = local_f0;
                      local_70 = uVar11;
                      pos_to_shape(out,shape_04,(int)uVar11);
                      if ((int)local_a0 == 0) {
                        local_d8 = (ulong)local_d8._4_4_ << 0x20;
                      }
                      else {
                        uVar18 = 0;
                        local_d8 = (ulong)local_d8._4_4_ << 0x20;
                        do {
                          out_00._0_8_ = local_88 & 0xffffffff;
                          shape_05._4_4_ = 0;
                          shape_05.size = local_f4;
                          out_00.data = piVar6;
                          shape_05.data = local_e8;
                          pos_to_shape(out_00,shape_05,(int)uVar18);
                          plVar24 = local_e0;
                          if (0 < (int)uVar7) {
                            uVar11 = 0;
                            do {
                              iVar9 = piVar6[uVar11] * *(int *)((long)piVar19 + uVar11 * 4);
                              piVar6[uVar11] = iVar9;
                              iVar9 = iVar9 - *(int *)(lVar16 + uVar11 * 4);
                              piVar6[uVar11] = iVar9;
                              iVar9 = *(int *)((long)local_50 + uVar11 * 4) * local_90[uVar11] +
                                      iVar9;
                              piVar6[uVar11] = iVar9;
                              if ((iVar9 < 0) || (piVar5[uVar11] <= iVar9)) goto LAB_0011adb2;
                              uVar11 = uVar11 + 1;
                            } while (uVar7 != uVar11);
                          }
                          lVar16 = (ulong)*(uint *)(local_e0 + 0xf) + (long)local_98;
                          shape_03._4_4_ = 0;
                          shape_03.size = uVar8;
                          pos._0_8_ = local_88 & 0xffffffff;
                          shape_03.data = piVar5;
                          pos.data = piVar6;
                          iVar9 = shape_to_pos(shape_03,pos);
                          local_d8 = CONCAT44(local_d8._4_4_,
                                              (int)local_d8 +
                                              (int)*(char *)(uVar18 + (ulong)*(uint *)(plVar24 +
                                                                                      0x17) +
                                                                      (long)local_58) *
                                              (int)*(char *)(iVar9 + lVar16));
                          lVar16 = local_68;
                          piVar19 = local_60;
LAB_0011adb2:
                          uVar18 = uVar18 + 1;
                        } while (uVar18 != local_d0);
                      }
                      iVar13 = (int)local_d8 / local_f8 +
                               (int)*(char *)(local_70 + (ulong)*(uint *)(local_e0 + 7) + local_80);
                      iVar9 = iVar13;
                      if (iVar13 < -0x7f) {
                        iVar9 = 0x80;
                      }
                      uVar12 = (undefined1)iVar9;
                      if (0x7e < iVar13) {
                        uVar12 = 0x7f;
                      }
                      *(undefined1 *)(local_70 + (ulong)*(uint *)(local_e0 + 7) + local_80) = uVar12
                      ;
                      uVar11 = local_70 + 1;
                    } while (uVar11 != local_38);
                  }
                  local_110[2] = local_44 + 1;
                  plVar24 = local_e0;
                } while (local_110[2] != local_fc);
              }
              local_110[0] = local_118;
              local_110[1] = local_48;
              lVar16 = plVar24[0x20];
              if (lVar16 != 0) {
                iVar9 = (int)plVar24[0x23];
                if (iVar9 < 1) {
                  iVar13 = 0;
                }
                else {
                  if (1 < iVar9) {
                    iVar9 = 2;
                  }
                  lVar14 = 0;
                  iVar13 = 0;
                  do {
                    iVar13 = iVar13 + *(int *)(plVar24[0x24] + lVar14 * 4) * local_110[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (iVar9 != (int)lVar14);
                }
                *(int *)(plVar24 + 0x27) = iVar13;
                lVar14 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar14) {
                  lVar22 = *(long *)(lVar16 + 0x18);
                  lVar15 = *(long *)(*plVar24 + 0x18);
                  bVar1 = *(byte *)(lVar16 + 0x10);
                  do {
                    *(char *)(lVar15 + (ulong)*(uint *)(plVar24 + 7)) =
                         (char)(((int)*(char *)(lVar15 + (ulong)*(uint *)(plVar24 + 7)) *
                                (int)*(char *)(lVar22 + (ulong)*(uint *)(plVar24 + 0x27))) /
                               (1 << (bVar1 >> 4)));
                    lVar15 = lVar15 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
              }
              if (plVar24[0x18] != 0) {
                iVar9 = (int)plVar24[0x1b];
                if (iVar9 < 1) {
                  iVar13 = 0;
                }
                else {
                  if (1 < iVar9) {
                    iVar9 = 2;
                  }
                  lVar16 = 0;
                  iVar13 = 0;
                  do {
                    iVar13 = iVar13 + *(int *)(plVar24[0x1c] + lVar16 * 4) * local_110[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (iVar9 != (int)lVar16);
                }
                *(int *)(plVar24 + 0x1f) = iVar13;
                lVar16 = (long)*(int *)(plVar24[4] + 8);
                if (0 < lVar16) {
                  lVar14 = *(long *)(plVar24[0x18] + 0x18);
                  lVar22 = *(long *)(*plVar24 + 0x18);
                  do {
                    bVar1 = *(byte *)(lVar14 + (ulong)*(uint *)(plVar24 + 0x1f));
                    bVar2 = *(byte *)(lVar22 + (ulong)*(uint *)(plVar24 + 7));
                    cVar20 = bVar2 + bVar1;
                    if ((((char)bVar1 < '\x01') || ((char)bVar2 < '\x01')) ||
                       (cVar21 = '\x7f', -1 < cVar20)) {
                      cVar21 = cVar20;
                      if ('\0' < cVar20) {
                        cVar21 = -0x80;
                      }
                      if (-1 < (char)(bVar2 & bVar1)) {
                        cVar21 = cVar20;
                      }
                    }
                    *(char *)(lVar22 + (ulong)*(uint *)(plVar24 + 7)) = cVar21;
                    lVar22 = lVar22 + 1;
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                }
              }
              local_48 = local_48 + 1;
            } while (local_48 != local_100);
          }
          local_118 = local_118 + 1;
        } while (local_118 != local_110[3]);
      }
      uVar7 = (int)local_a8 + 1;
      local_a8 = (ulong)uVar7;
    } while (uVar7 != local_c4);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_convolution_int8(rt_function_t *f) {
  convolution_local_context_t *c =
      (convolution_local_context_t *)f->local_context;
  convolution_private_t *p = (convolution_private_t *)(c->data);

  nn_size_t group = c->group;
  nn_size_t in_vars = p->in_var.shape.data[I];
  nn_size_t out_vars = p->out_var.shape.data[I];
  nn_size_t batch_size;
  nn_size_t om, im, g, b;

  var_t *out_var = &p->out_var;
  var_t *in_var = &p->in_var;
  var_t *w_var = &p->w_var;
  var_t *b_var = &p->b_var;
  var_t *a_var = &p->a_var;

  const unsigned output_size = calc_shape_size(out_var->shape);
  const unsigned bias_size = calc_shape_size(b_var->shape);

  if (p->b_var.v) {
    unsigned int b_fp = b_var->v->fp_pos;
    unsigned int out_fp = out_var->v->fp_pos;

    // If bias has less range bits (=more precision bits) than output, rescale
    // bias.
    // Otherwise, output has too few range bits. Change format before starting
    // computations.
    if (b_fp > out_fp) {
      int i;
      int8_t *b_data = (int8_t *)(b_var->v->data);
      for (i = 0; i < bias_size; i++) {
        *(b_data + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure conv/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  memset(out_var->v->data, 0, sizeof(int8_t) * output_size);

  batch_size = p->in_var.shape.data[0];
  if (p->spatial_dims == 2) {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            conv2d(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  } else {
    for (b = 0; b < batch_size; ++b) {
      for (g = 0; g < group; ++g) {
        for (om = 0; om < out_vars; ++om) {
          int o_pos[] = {b, g, om};
          var_setpos(out_var, o_pos, _S(o_pos));
          for (im = 0; im < in_vars; ++im) {
            int i_pos[] = {b, g, im};
            int w_pos[] = {g, om, im};
            var_setpos(in_var, i_pos, _S(i_pos));
            var_setpos(w_var, w_pos, _S(w_pos));
            convnd(out_var, in_var, w_var, p->input_shape, p->output_shape,
                   p->kernel_shape, p->in_position, p->out_position, c->pad,
                   c->stride, c->dilation, p->spatial_dims);
          }
          {
            int b_pos[] = {g, om};
            if (p->a_var.v) {
              var_setpos(a_var, b_pos, _S(b_pos));
              mul_alpha(out_var, a_var);
            }
            if (p->b_var.v) {
              var_setpos(b_var, b_pos, _S(b_pos));
              add_bias(out_var, b_var);
            }
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}